

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_constraint.cpp
# Opt level: O2

void __thiscall duckdb::NotNullConstraint::Serialize(NotNullConstraint *this,Serializer *serializer)

{
  Constraint::Serialize(&this->super_Constraint,serializer);
  Serializer::WriteProperty<duckdb::LogicalIndex>(serializer,200,"index",&this->index);
  return;
}

Assistant:

void NotNullConstraint::Serialize(Serializer &serializer) const {
	Constraint::Serialize(serializer);
	serializer.WriteProperty<LogicalIndex>(200, "index", index);
}